

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeDeferredSeek(WhereInfo *pWInfo,Index *pIdx,int iCur,int iIdxCur)

{
  i16 iCol;
  Parse *pPVar1;
  Vdbe *p;
  Table *pTab_00;
  i16 iVar2;
  int *zP4;
  Parse *local_58;
  int x2;
  int x1;
  u32 *ai;
  Table *pTab;
  int i;
  Vdbe *v;
  Parse *pParse;
  int iIdxCur_local;
  int iCur_local;
  Index *pIdx_local;
  WhereInfo *pWInfo_local;
  
  pPVar1 = pWInfo->pParse;
  p = pPVar1->pVdbe;
  pWInfo->field_0x44 = pWInfo->field_0x44 & 0xfe | 1;
  sqlite3VdbeAddOp3(p,0x8d,iIdxCur,0,iCur);
  if ((pWInfo->wctrlFlags & 0x1020) != 0) {
    local_58 = pPVar1;
    if (pPVar1->pToplevel != (Parse *)0x0) {
      local_58 = pPVar1->pToplevel;
    }
    if (local_58->writeMask == 0) {
      pTab_00 = pIdx->pTable;
      zP4 = (int *)sqlite3DbMallocZero(pPVar1->db,(long)(pTab_00->nCol + 1) << 2);
      if (zP4 != (int *)0x0) {
        *zP4 = (int)pTab_00->nCol;
        for (pTab._4_4_ = 0; pTab._4_4_ < (int)(pIdx->nColumn - 1); pTab._4_4_ = pTab._4_4_ + 1) {
          iCol = pIdx->aiColumn[pTab._4_4_];
          iVar2 = sqlite3TableColumnToStorage(pTab_00,iCol);
          if (-1 < iCol) {
            zP4[iVar2 + 1] = pTab._4_4_ + 1;
          }
        }
        sqlite3VdbeChangeP4(p,-1,(char *)zP4,-0xe);
      }
    }
  }
  return;
}

Assistant:

static void codeDeferredSeek(
  WhereInfo *pWInfo,              /* Where clause context */
  Index *pIdx,                    /* Index scan is using */
  int iCur,                       /* Cursor for IPK b-tree */
  int iIdxCur                     /* Index cursor */
){
  Parse *pParse = pWInfo->pParse; /* Parse context */
  Vdbe *v = pParse->pVdbe;        /* Vdbe to generate code within */

  assert( iIdxCur>0 );
  assert( pIdx->aiColumn[pIdx->nColumn-1]==-1 );

  pWInfo->bDeferredSeek = 1;
  sqlite3VdbeAddOp3(v, OP_DeferredSeek, iIdxCur, 0, iCur);
  if( (pWInfo->wctrlFlags & (WHERE_OR_SUBCLAUSE|WHERE_RIGHT_JOIN))
   && DbMaskAllZero(sqlite3ParseToplevel(pParse)->writeMask)
  ){
    int i;
    Table *pTab = pIdx->pTable;
    u32 *ai = (u32*)sqlite3DbMallocZero(pParse->db, sizeof(u32)*(pTab->nCol+1));
    if( ai ){
      ai[0] = pTab->nCol;
      for(i=0; i<pIdx->nColumn-1; i++){
        int x1, x2;
        assert( pIdx->aiColumn[i]<pTab->nCol );
        x1 = pIdx->aiColumn[i];
        x2 = sqlite3TableColumnToStorage(pTab, x1);
        testcase( x1!=x2 );
        if( x1>=0 ) ai[x2+1] = i+1;
      }
      sqlite3VdbeChangeP4(v, -1, (char*)ai, P4_INTARRAY);
    }
  }
}